

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.h
# Opt level: O1

FaceIter __thiscall CMU462::HalfedgeMesh::newBoundary(HalfedgeMesh *this)

{
  size_t *psVar1;
  _Node *p_Var2;
  Face FStack_a8;
  
  memset(&FStack_a8,0,0x88);
  FStack_a8._isBoundary = true;
  p_Var2 = std::__cxx11::list<CMU462::Face,_std::allocator<CMU462::Face>_>::
           _M_create_node<CMU462::Face>(&this->boundaries,&FStack_a8);
  std::__detail::_List_node_base::_M_hook(&p_Var2->super__List_node_base);
  psVar1 = &(this->boundaries).super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>._M_impl
            ._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return (FaceIter)&p_Var2->super__List_node_base;
}

Assistant:

FaceIter newBoundary() { return boundaries.insert(boundaries.end(), Face(true)); }